

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O2

_ElementType __thiscall
Lib::
FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Inferences::BackwardDemodulation::RewritableClausesFn,_Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::BackwardDemodulation::ResultFn,_Inferences::BwSimplificationRecord>,_Inferences::BackwardDemodulation::RemovedIsNonzeroFn,_false>
::next(FilteredIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::TypedTermList>,_Inferences::BackwardDemodulation::RewritableClausesFn,_Lib::VirtualIterator<std::pair<Kernel::TypedTermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::BackwardDemodulation::ResultFn,_Inferences::BwSimplificationRecord>,_Inferences::BackwardDemodulation::RemovedIsNonzeroFn,_false>
       *this)

{
  _ElementType _Var1;
  
  hasNext(this);
  (this->_next).super_OptionBase<Inferences::BwSimplificationRecord>._isSome = false;
  _Var1.toRemove =
       *(Clause **)&(this->_next).super_OptionBase<Inferences::BwSimplificationRecord>._elem._elem;
  _Var1.replacement =
       *(Clause **)
        ((long)&(this->_next).super_OptionBase<Inferences::BwSimplificationRecord>._elem._elem + 8);
  return _Var1;
}

Assistant:

OWN_ELEMENT_TYPE next()
  {
    ALWAYS(hasNext());
    ASS(_next.isSome());
    OWN_ELEMENT_TYPE out = move_if_value<OWN_ELEMENT_TYPE>(_next.unwrap());
    _next = Option<OWN_ELEMENT_TYPE>();
    return out;
  }